

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O1

void y4m_convert_444_420jpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  ulong uVar1;
  int iVar2;
  int _c_h;
  int iVar3;
  uchar uVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int _c_w;
  uint uVar13;
  int iVar14;
  uchar *_dst_00;
  uint uVar15;
  uchar *_src;
  long lVar16;
  
  iVar2 = _y4m->pic_w;
  _c_h = _y4m->pic_h;
  _dst_00 = _dst + _c_h * iVar2;
  iVar3 = (iVar2 + _y4m->src_c_dec_h + -1) / _y4m->src_c_dec_h;
  _c_w = (iVar2 + _y4m->dst_c_dec_h + -1) / _y4m->dst_c_dec_h;
  iVar2 = _y4m->dst_c_dec_v;
  _src = _aux + _c_h * iVar3 * 2;
  iVar5 = iVar3 + -1;
  iVar14 = 1;
  iVar8 = 1;
  if (iVar5 < 1) {
    iVar8 = iVar5;
  }
  iVar9 = 2;
  if (iVar5 < 2) {
    iVar9 = iVar5;
  }
  iVar10 = 3;
  if (iVar5 == 2 || SBORROW4(iVar5,2) != iVar3 + -3 < 0) {
    iVar10 = iVar5;
  }
  lVar16 = (long)iVar3;
  do {
    if (0 < _c_h) {
      iVar5 = 0;
      do {
        uVar11 = 0;
        if (0 < iVar3) {
          iVar6 = (int)((uint)_aux[iVar10] + (uint)_aux[iVar10] * 2 +
                        (uint)_aux[iVar8] * 0x4e + (uint)*_aux * 0x40 + (uint)_aux[iVar9] * -0x11 +
                       0x40) >> 7;
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          uVar4 = (uchar)iVar6;
          if (iVar6 < 1) {
            uVar4 = '\0';
          }
          *_src = uVar4;
          uVar11 = 2;
        }
        if ((int)uVar11 < iVar3 + -3) {
          uVar12 = (ulong)uVar11;
          puVar7 = _src + (uVar11 >> 1);
          do {
            iVar6 = (int)(((uint)_aux[uVar12 + 3] + (uint)_aux[uVar12 - 2]) * 3 +
                          ((uint)_aux[uVar12 + 2] + (uint)_aux[uVar12 - 1]) * -0x11 +
                          ((uint)_aux[uVar12 + 1] + (uint)_aux[uVar12]) * 0x4e + 0x40) >> 7;
            if (0xfe < iVar6) {
              iVar6 = 0xff;
            }
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            uVar12 = uVar12 + 2;
            *puVar7 = (uchar)iVar6;
            puVar7 = puVar7 + 1;
          } while ((long)uVar12 < (long)(iVar3 + -3));
          uVar11 = (uint)uVar12;
        }
        if ((int)uVar11 < iVar3) {
          puVar7 = _src + (uVar11 >> 1);
          uVar12 = (ulong)uVar11;
          do {
            uVar1 = uVar12 + 2;
            uVar15 = (uint)(lVar16 + -1);
            uVar11 = uVar15;
            if ((int)(uint)uVar1 < (int)uVar15) {
              uVar11 = (uint)uVar1;
            }
            uVar13 = (uint)uVar12 | 1;
            if ((int)uVar15 <= (int)uVar13) {
              uVar13 = uVar15;
            }
            iVar6 = (int)(((uint)_aux[lVar16 + -1] + (uint)_aux[uVar12 - 2]) * 3 +
                          ((uint)_aux[(int)uVar11] + (uint)_aux[uVar12 - 1]) * -0x11 +
                          ((uint)_aux[(int)uVar13] + (uint)_aux[uVar12]) * 0x4e + 0x40) >> 7;
            if (0xfe < iVar6) {
              iVar6 = 0xff;
            }
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            *puVar7 = (uchar)iVar6;
            puVar7 = puVar7 + 1;
            uVar12 = uVar1;
          } while ((long)uVar1 < lVar16);
        }
        _src = _src + _c_w;
        _aux = _aux + lVar16;
        iVar5 = iVar5 + 1;
      } while (iVar5 != _c_h);
    }
    _src = _src + -(long)(_c_w * _c_h);
    y4m_422jpeg_420jpeg_helper(_dst_00,_src,_c_w,_c_h);
    _dst_00 = _dst_00 + ((_c_h + iVar2 + -1) / iVar2) * _c_w;
    iVar14 = iVar14 + 1;
  } while (iVar14 != 3);
  return;
}

Assistant:

static void y4m_convert_444_420jpeg(y4m_input *_y4m, unsigned char *_dst,
                                    unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int dst_c_w;
  int dst_c_h;
  int dst_c_sz;
  int tmp_sz;
  int pli;
  int y;
  int x;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + _y4m->src_c_dec_h - 1) / _y4m->src_c_dec_h;
  c_h = _y4m->pic_h;
  dst_c_w = (_y4m->pic_w + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  dst_c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  dst_c_sz = dst_c_w * dst_c_h;
  tmp_sz = dst_c_w * c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*Filter: [3 -17 78 78 -17 3]/128, derived from a 6-tap Lanczos window.*/
    for (y = 0; y < c_h; y++) {
      for (x = 0; x < OC_MINI(c_w, 2); x += 2) {
        tmp[x >> 1] = OC_CLAMPI(0,
                                (64 * _aux[0] + 78 * _aux[OC_MINI(1, c_w - 1)] -
                                 17 * _aux[OC_MINI(2, c_w - 1)] +
                                 3 * _aux[OC_MINI(3, c_w - 1)] + 64) >>
                                    7,
                                255);
      }
      for (; x < c_w - 3; x += 2) {
        tmp[x >> 1] = OC_CLAMPI(0,
                                (3 * (_aux[x - 2] + _aux[x + 3]) -
                                 17 * (_aux[x - 1] + _aux[x + 2]) +
                                 78 * (_aux[x] + _aux[x + 1]) + 64) >>
                                    7,
                                255);
      }
      for (; x < c_w; x += 2) {
        tmp[x >> 1] =
            OC_CLAMPI(0,
                      (3 * (_aux[x - 2] + _aux[c_w - 1]) -
                       17 * (_aux[x - 1] + _aux[OC_MINI(x + 2, c_w - 1)]) +
                       78 * (_aux[x] + _aux[OC_MINI(x + 1, c_w - 1)]) + 64) >>
                          7,
                      255);
      }
      tmp += dst_c_w;
      _aux += c_w;
    }
    tmp -= tmp_sz;
    /*Now do the vertical filtering.*/
    y4m_422jpeg_420jpeg_helper(_dst, tmp, dst_c_w, c_h);
    _dst += dst_c_sz;
  }
}